

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::clausePrimitive(SelectionCompiler *this)

{
  bool bVar1;
  uint uVar2;
  SelectionCompiler *in_stack_00000008;
  SelectionCompiler *in_stack_00000018;
  SelectionCompiler *in_stack_00000038;
  SelectionCompiler *in_stack_00000068;
  int tok;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  SelectionCompiler *this_00;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined4 in_stack_ffffffffffffff88;
  int local_70;
  SelectionCompiler *in_stack_ffffffffffffff98;
  SelectionCompiler *in_stack_ffffffffffffffb0;
  undefined4 local_14;
  byte local_1;
  
  uVar2 = tokPeek((SelectionCompiler *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78)
                 );
  local_14 = uVar2;
  if (uVar2 != 1) {
    if (uVar2 == 2) {
      local_1 = clauseIndex(in_stack_00000068);
      goto LAB_002f4c20;
    }
    if (uVar2 == 0x400) {
      tokenNext((SelectionCompiler *)CONCAT44(0x400,in_stack_ffffffffffffff88));
      Token::~Token((Token *)0x2f4baa);
      bVar1 = clauseOr(in_stack_ffffffffffffff98);
      if (bVar1) {
        tokenNext((SelectionCompiler *)CONCAT44(uVar2,in_stack_ffffffffffffff88));
        Token::~Token((Token *)0x2f4be3);
        if (local_70 == 0x401) {
          local_1 = 1;
        }
        else {
          local_1 = rightParenthesisExpected(in_stack_ffffffffffffffb0);
        }
      }
      else {
        local_1 = 0;
      }
      goto LAB_002f4c20;
    }
    if (uVar2 != 0x407) {
      if (1 < uVar2 - 0x409) {
        if (uVar2 == 0x1406) {
          local_1 = clauseWithin(in_stack_00000038);
          goto LAB_002f4c20;
        }
        if (uVar2 != 0x140c) {
          if (uVar2 == 0x140d) {
            local_1 = clauseAlphaHull(in_stack_00000018);
            goto LAB_002f4c20;
          }
          if ((uVar2 & 0x1c00) == 0x1c00) {
            local_1 = clauseComparator(in_stack_00000018);
            goto LAB_002f4c20;
          }
          if ((uVar2 & 0x4400) != 0x4400) {
            local_1 = unrecognizedExpressionToken(in_stack_00000038);
            goto LAB_002f4c20;
          }
        }
      }
      this_00 = (SelectionCompiler *)&stack0xffffffffffffffd0;
      tokenNext((SelectionCompiler *)CONCAT44(uVar2,in_stack_ffffffffffffff88));
      local_1 = addTokenToPostfix(this_00,(Token *)CONCAT44(in_stack_ffffffffffffff6c,
                                                            in_stack_ffffffffffffff68));
      Token::~Token((Token *)0x2f4b6f);
      goto LAB_002f4c20;
    }
  }
  local_1 = clauseChemObjName(in_stack_00000008);
LAB_002f4c20:
  return (bool)(local_1 & 1);
}

Assistant:

bool SelectionCompiler::clausePrimitive() {
    int tok = tokPeek();
    switch (tok) {
    case Token::within:
      return clauseWithin();

    case Token::alphahull:
      return clauseAlphaHull();

    case Token::asterisk:
    case Token::identifier:
      return clauseChemObjName();

    case Token::integer:
      return clauseIndex();
    default:
      if ((tok & Token::atomproperty) == Token::atomproperty) {
        return clauseComparator();
      }
      if ((tok & Token::predefinedset) != Token::predefinedset) { break; }
      // fall into the code and below and just add the token
      [[fallthrough]];
    case Token::all:
    case Token::none:
    case Token::hull:
      return addTokenToPostfix(tokenNext());
    case Token::leftparen:
      tokenNext();
      if (!clauseOr()) { return false; }
      if (tokenNext().tok != Token::rightparen) {
        return rightParenthesisExpected();
      }
      return true;
    }
    return unrecognizedExpressionToken();
  }